

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_emit_x86.h
# Opt level: O0

void emit_rr(ASMState *as,x86Op xo,Reg r1,Reg r2)

{
  MCode *pMVar1;
  int iVar2;
  byte *pbVar3;
  MCode *p;
  Reg r2_local;
  Reg r1_local;
  x86Op xo_local;
  ASMState *as_local;
  uint32_t rex;
  int n;
  byte *local_18;
  
  pMVar1 = as->mcp;
  pMVar1[-1] = (char)((r1 & 7) << 3) + -0x40 + ((byte)r2 & 7);
  *(x86Op *)(pMVar1 + -5) = xo;
  pbVar3 = pMVar1 + (int)(char)xo;
  iVar2 = (r1 >> 1 & 0x104) + 0x40 + (r2 >> 3 & 1);
  local_18 = pbVar3;
  if (iVar2 != 0x40) {
    rex._0_1_ = (byte)(r1 >> 0x10) | (byte)iVar2;
    if ((char)xo == -4) {
      *pbVar3 = (byte)rex;
      rex._0_1_ = (byte)(xo >> 8);
    }
    else if ((xo & 0xffffff) == 0x6600fd) {
      *pbVar3 = (byte)rex;
      rex._0_1_ = 0x66;
    }
    local_18 = pbVar3 + -1;
    pbVar3[-1] = (byte)rex;
  }
  as->mcp = local_18;
  return;
}

Assistant:

static void emit_rr(ASMState *as, x86Op xo, Reg r1, Reg r2)
{
  MCode *p = as->mcp;
  as->mcp = emit_opm(xo, XM_REG, r1, r2, p, 0);
}